

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC8uv_SSE2(uint8_t *dst)

{
  uint8_t *in_RDI;
  undefined1 auVar1 [16];
  int DC;
  int j;
  int left;
  __m128i sum;
  __m128i top;
  __m128i zero;
  int local_c0;
  int local_bc;
  int local_48;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(in_RDI + -0x20);
  auVar1 = psadbw(auVar1,ZEXT816(0));
  local_bc = 0;
  for (local_c0 = 0; local_c0 < 8; local_c0 = local_c0 + 1) {
    local_bc = (uint)in_RDI[local_c0 * 0x20 + -1] + local_bc;
  }
  local_48 = auVar1._0_4_;
  Put8x8uv_SSE2((uint8_t)(local_48 + local_bc + 8 >> 4),in_RDI);
  return;
}

Assistant:

static void DC8uv_SSE2(uint8_t* dst) {     // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadl_epi64((const __m128i*)(dst - BPS));
  const __m128i sum = _mm_sad_epu8(top, zero);
  int left = 0;
  int j;
  for (j = 0; j < 8; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 8;
    Put8x8uv_SSE2(DC >> 4, dst);
  }
}